

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_decoder.h
# Opt level: O1

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::DecodePredictionData
          (MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,DecoderBuffer *buffer)

{
  long lVar1;
  vector<bool,_std::allocator<bool>_> *this_00;
  CornerTable *pCVar2;
  _Bit_type *p_Var3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  uint32_t i;
  ulong uVar7;
  byte bVar8;
  ulong __new_size;
  uint32_t num_orientations;
  RAnsBitDecoder decoder;
  uint local_54;
  MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  *local_50;
  RAnsBitDecoder local_48;
  
  local_54 = 0;
  local_50 = this;
  if (buffer->bitstream_version_ < 0x202) {
    lVar1 = buffer->pos_ + 4;
    if (buffer->data_size_ < lVar1) {
      return false;
    }
    local_54 = *(uint *)(buffer->data_ + buffer->pos_);
    buffer->pos_ = lVar1;
  }
  else {
    bVar4 = anon_unknown_80::DecodeVarintUnsigned<unsigned_int>(1,&local_54,buffer);
    if (!bVar4) {
      return false;
    }
  }
  __new_size = (ulong)local_54;
  if ((__new_size != 0) &&
     (pCVar2 = ((local_50->
                super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                ).mesh_data_.corner_table_)->corner_table_,
     local_54 <=
     (uint)((ulong)((long)(pCVar2->corner_to_vertex_map_).vector_.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pCVar2->corner_to_vertex_map_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 2))) {
    this_00 = &local_50->orientations_;
    std::vector<bool,_std::allocator<bool>_>::resize(this_00,__new_size,false);
    RAnsBitDecoder::RAnsBitDecoder(&local_48);
    bVar4 = RAnsBitDecoder::StartDecoding(&local_48,buffer);
    if (bVar4) {
      bVar8 = 1;
      uVar7 = 0;
      do {
        bVar4 = RAnsBitDecoder::DecodeNextBit(&local_48);
        bVar8 = bVar8 ^ bVar4 ^ 1;
        p_Var3 = (this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        uVar5 = uVar7 >> 6;
        uVar6 = 1L << ((byte)uVar7 & 0x3f);
        if (bVar8 == 0) {
          uVar6 = ~uVar6 & p_Var3[uVar5];
        }
        else {
          uVar6 = uVar6 | p_Var3[uVar5];
        }
        p_Var3[uVar5] = uVar6;
        uVar7 = uVar7 + 1;
      } while (__new_size != uVar7);
      bVar4 = PredictionSchemeWrapDecodingTransform<int,_int>::DecodeTransformData
                        (&(local_50->
                          super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                          ).
                          super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                          .transform_,buffer);
    }
    else {
      bVar4 = false;
    }
    RAnsBitDecoder::~RAnsBitDecoder(&local_48);
    return bVar4;
  }
  return false;
}

Assistant:

bool MeshPredictionSchemeTexCoordsDecoder<DataTypeT, TransformT, MeshDataT>::
    DecodePredictionData(DecoderBuffer *buffer) {
  // Decode the delta coded orientations.
  uint32_t num_orientations = 0;
  if (buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    if (!buffer->Decode(&num_orientations)) {
      return false;
    }
  } else {
    if (!DecodeVarint(&num_orientations, buffer)) {
      return false;
    }
  }
  if (num_orientations == 0) {
    return false;
  }
  if (num_orientations > this->mesh_data().corner_table()->num_corners()) {
    // We can't have more orientations than the maximum number of decoded
    // values.
    return false;
  }
  orientations_.resize(num_orientations);
  bool last_orientation = true;
  RAnsBitDecoder decoder;
  if (!decoder.StartDecoding(buffer)) {
    return false;
  }
  for (uint32_t i = 0; i < num_orientations; ++i) {
    if (!decoder.DecodeNextBit()) {
      last_orientation = !last_orientation;
    }
    orientations_[i] = last_orientation;
  }
  decoder.EndDecoding();
  return MeshPredictionSchemeDecoder<DataTypeT, TransformT,
                                     MeshDataT>::DecodePredictionData(buffer);
}